

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

bool __thiscall ON_XMLNodePrivate::RemoveProperty(ON_XMLNodePrivate *this,wchar_t *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ON_XMLProperty **ppOVar3;
  ON_XMLProperty *pOVar4;
  ON_XMLProperty *pOVar5;
  
  pOVar5 = this->m_first_property;
  if (pOVar5 == (ON_XMLProperty *)0x0) {
LAB_00682889:
    bVar1 = false;
  }
  else {
    iVar2 = (*pOVar5->_vptr_ON_XMLProperty[2])(pOVar5);
    iVar2 = ON_wString::CompareNoCase((ON_wString *)CONCAT44(extraout_var,iVar2),name);
    if (iVar2 == 0) {
      pOVar4 = (ON_XMLProperty *)0x0;
    }
    else {
      do {
        pOVar4 = pOVar5;
        pOVar5 = pOVar4->_private->_next;
        if (pOVar5 == (ON_XMLProperty *)0x0) goto LAB_00682889;
        iVar2 = (*pOVar5->_vptr_ON_XMLProperty[2])(pOVar5);
        iVar2 = ON_wString::CompareNoCase((ON_wString *)CONCAT44(extraout_var_00,iVar2),name);
      } while (iVar2 != 0);
    }
    iVar2 = (*pOVar5->_vptr_ON_XMLProperty[5])(pOVar5);
    if (pOVar4 == (ON_XMLProperty *)0x0) {
      ppOVar3 = &this->m_first_property;
    }
    else {
      ppOVar3 = &pOVar4->_private->_next;
    }
    *ppOVar3 = (ON_XMLProperty *)CONCAT44(extraout_var_01,iVar2);
    (*pOVar5->_vptr_ON_XMLProperty[1])(pOVar5);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ON_XMLNodePrivate::RemoveProperty(const wchar_t* name)
{
  ON_XMLProperty* pPrev = nullptr;

  auto* pProp = m_first_property;
  while (nullptr != pProp)
  {
    if (pProp->Name().CompareNoCase(name) == 0)
    {
      if (nullptr == pPrev)
      {
        m_first_property = pProp->Next();
      }
      else
      {
        pPrev->_private->_next = pProp->Next();
      }

      delete pProp;
      return true;
    }

    pPrev = pProp;
    pProp = pProp->_private->_next;
  }

  return false;
}